

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint width,uint height,uint pitch,
          color_quad<unsigned_char,_int> *background,uint flags)

{
  this->m_comp_flags = flags;
  (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (this->m_pixel_buf).m_size = 0;
  (this->m_pixel_buf).m_capacity = 0;
  if (pitch == 0xffffffff) {
    pitch = width;
  }
  vector<crnlib::color_quad<unsigned_char,_int>_>::resize(&this->m_pixel_buf,pitch * height,false);
  this->m_width = width;
  this->m_height = height;
  this->m_pitch = pitch;
  this->m_total = pitch * height;
  this->m_pPixels = (this->m_pixel_buf).m_p;
  set_all(this,background);
  return;
}

Assistant:

image(uint width, uint height, uint pitch = UINT_MAX, const color_type& background = color_type::make_black(), uint flags = pixel_format_helpers::cDefaultCompFlags) :
            m_comp_flags(flags)
        {
            CRNLIB_ASSERT((width > 0) && (height > 0));
            if (pitch == UINT_MAX)
            {
                pitch = width;
            }

            m_pixel_buf.resize(pitch * height);

            m_width = width;
            m_height = height;
            m_pitch = pitch;
            m_total = m_pitch * m_height;

            m_pPixels = &m_pixel_buf.front();

            set_all(background);
        }